

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void ** stb_array_block_alloc(int count,int blocksize)

{
  void **ppvVar1;
  void **ppvVar2;
  ulong uVar3;
  void **ppvVar4;
  bool bVar5;
  
  ppvVar1 = (void **)malloc((long)(count * blocksize) + (long)count * 8);
  if (ppvVar1 != (void **)0x0) {
    ppvVar2 = ppvVar1 + count;
    uVar3 = 0;
    ppvVar4 = ppvVar1;
    if (0 < count) {
      uVar3 = (ulong)(uint)count;
    }
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      *ppvVar4 = ppvVar2;
      ppvVar2 = (void **)((long)ppvVar2 + (long)blocksize);
      ppvVar4 = ppvVar4 + 1;
    }
  }
  return ppvVar1;
}

Assistant:

void **stb_array_block_alloc(int count, int blocksize)
{
   int i;
   char *p = (char *) malloc(sizeof(void *) * count + count * blocksize);
   void **q;
   if (p == NULL) return NULL;
   q = (void **) p;
   p += sizeof(void *) * count;
   for (i=0; i < count; ++i)
      q[i] = p + i * blocksize;
   return q;
}